

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O1

void __thiscall HighsPrimalHeuristics::flushStatistics(HighsPrimalHeuristics *this)

{
  undefined8 uVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  size_t sVar3;
  undefined1 auVar4 [16];
  
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  sVar3 = this->total_repair_lp_feasible;
  (_Var2._M_head_impl)->total_repair_lp =
       (_Var2._M_head_impl)->total_repair_lp + this->total_repair_lp;
  (_Var2._M_head_impl)->total_repair_lp_feasible =
       (_Var2._M_head_impl)->total_repair_lp_feasible + sVar3;
  (_Var2._M_head_impl)->total_repair_lp_iterations =
       (_Var2._M_head_impl)->total_repair_lp_iterations + this->total_repair_lp_iterations;
  this->total_repair_lp_iterations = 0;
  this->total_repair_lp = 0;
  this->total_repair_lp_feasible = 0;
  uVar1 = this->lp_iterations;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
  (_Var2._M_head_impl)->total_lp_iterations = uVar1 + (_Var2._M_head_impl)->total_lp_iterations;
  (_Var2._M_head_impl)->heuristic_lp_iterations =
       auVar4._8_8_ + (_Var2._M_head_impl)->heuristic_lp_iterations;
  this->lp_iterations = 0;
  return;
}

Assistant:

void HighsPrimalHeuristics::flushStatistics() {
  mipsolver.mipdata_->total_repair_lp += total_repair_lp;
  mipsolver.mipdata_->total_repair_lp_feasible += total_repair_lp_feasible;
  mipsolver.mipdata_->total_repair_lp_iterations += total_repair_lp_iterations;
  total_repair_lp = 0;
  total_repair_lp_feasible = 0;
  total_repair_lp_iterations = 0;
  mipsolver.mipdata_->heuristic_lp_iterations += lp_iterations;
  mipsolver.mipdata_->total_lp_iterations += lp_iterations;
  lp_iterations = 0;
}